

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis_simplification.cpp
# Opt level: O0

SENode * __thiscall
spvtools::opt::SENodeSimplifyImpl::FoldRecurrentAddExpressions
          (SENodeSimplifyImpl *this,SENode *root)

{
  ScalarEvolutionAnalysis *pSVar1;
  initializer_list<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_> __l;
  vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>
  *loop_00;
  bool bVar2;
  bool bVar3;
  int iVar4;
  SEAddNode *this_00;
  reference ppSVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  mapped_type *pmVar6;
  reference ppVar7;
  pointer pSVar8;
  reference ppVar9;
  SERecurrentNode *pSVar10;
  undefined4 extraout_var_01;
  int64_t iVar11;
  pointer pSVar12;
  pointer pSVar13;
  SENode *pSVar14;
  ChildContainerType *this_01;
  size_type sVar15;
  SENodeSimplifyImpl *pSVar16;
  pair<spvtools::opt::SERecurrentNode_*,_bool> pVar17;
  unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_> local_1b8;
  unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_> local_1b0;
  SENodeSimplifyImpl *local_1a8;
  SENode *new_offset_simplified;
  SENode *new_coefficient_simplified;
  unique_ptr<spvtools::opt::SERecurrentNode,_std::default_delete<spvtools::opt::SERecurrentNode>_>
  new_recurrent;
  bool negative;
  SERecurrentNode *node;
  pair<spvtools::opt::SERecurrentNode_*,_bool> node_pair;
  iterator __end3;
  iterator __begin3;
  vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>
  *__range3;
  unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_> new_offset;
  unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_> new_coefficient;
  Loop *loop_1;
  vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>
  *recurrent_expressions;
  pair<const_spvtools::opt::Loop_*const,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>_>
  pair;
  iterator __end2_1;
  iterator __begin2_1;
  map<const_spvtools::opt::Loop_*,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_spvtools::opt::Loop_*const,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>_>_>_>
  *__range2_1;
  value_type local_e8;
  SERecurrentNode *local_d8;
  undefined1 local_d0;
  pair<spvtools::opt::SERecurrentNode_*,_bool> local_c8;
  iterator local_b8;
  size_type local_b0;
  _Self local_a8;
  _Self local_a0;
  SERecurrentNode *local_98;
  SERecurrentNode *rec;
  Loop *loop;
  SENode *pSStack_80;
  bool negation;
  SENode *child;
  iterator __end2;
  iterator __begin2;
  SENode *__range2;
  undefined1 local_58 [7];
  bool has_multiple_same_loop_recurrent_terms;
  map<const_spvtools::opt::Loop_*,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_spvtools::opt::Loop_*const,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>_>_>_>
  loops_to_recurrent;
  unique_ptr<spvtools::opt::SEAddNode,_std::default_delete<spvtools::opt::SEAddNode>_> new_node;
  SENode *root_local;
  SENodeSimplifyImpl *this_local;
  
  this_00 = (SEAddNode *)::operator_new(0x30);
  SEAddNode::SEAddNode(this_00,this->analysis_);
  std::unique_ptr<spvtools::opt::SEAddNode,std::default_delete<spvtools::opt::SEAddNode>>::
  unique_ptr<std::default_delete<spvtools::opt::SEAddNode>,void>
            ((unique_ptr<spvtools::opt::SEAddNode,std::default_delete<spvtools::opt::SEAddNode>> *)
             &loops_to_recurrent._M_t._M_impl.super__Rb_tree_header._M_node_count,this_00);
  memset(local_58,0,0x30);
  std::
  map<const_spvtools::opt::Loop_*,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_spvtools::opt::Loop_*const,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>_>_>_>
  ::map((map<const_spvtools::opt::Loop_*,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_spvtools::opt::Loop_*const,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>_>_>_>
         *)local_58);
  bVar3 = false;
  __end2 = SENode::begin(root);
  child = (SENode *)SENode::end(root);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>
                                     *)&child), bVar2) {
    ppSVar5 = __gnu_cxx::
              __normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>
              ::operator*(&__end2);
    pSStack_80 = *ppSVar5;
    loop._7_1_ = 0;
    iVar4 = (**pSStack_80->_vptr_SENode)();
    if (iVar4 == 4) {
      pSStack_80 = SENode::GetChild(pSStack_80,0);
      loop._7_1_ = 1;
    }
    iVar4 = (**pSStack_80->_vptr_SENode)();
    if (iVar4 == 1) {
      iVar4 = (*pSStack_80->_vptr_SENode[6])();
      rec = (SERecurrentNode *)
            SERecurrentNode::GetLoop((SERecurrentNode *)CONCAT44(extraout_var,iVar4));
      iVar4 = (*pSStack_80->_vptr_SENode[6])();
      local_98 = (SERecurrentNode *)CONCAT44(extraout_var_00,iVar4);
      local_a0._M_node =
           (_Base_ptr)
           std::
           map<const_spvtools::opt::Loop_*,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_spvtools::opt::Loop_*const,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>_>_>_>
           ::find((map<const_spvtools::opt::Loop_*,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_spvtools::opt::Loop_*const,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>_>_>_>
                   *)local_58,(key_type *)&rec);
      local_a8._M_node =
           (_Base_ptr)
           std::
           map<const_spvtools::opt::Loop_*,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_spvtools::opt::Loop_*const,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>_>_>_>
           ::end((map<const_spvtools::opt::Loop_*,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_spvtools::opt::Loop_*const,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>_>_>_>
                  *)local_58);
      bVar2 = std::operator==(&local_a0,&local_a8);
      if (bVar2) {
        pVar17 = std::make_pair<spvtools::opt::SERecurrentNode*&,bool&>
                           (&local_98,(bool *)((long)&loop + 7));
        local_d8 = pVar17.first;
        local_d0 = pVar17.second;
        local_b8 = &local_c8;
        local_b0 = 1;
        local_c8.first = local_d8;
        local_c8.second = (bool)local_d0;
        pmVar6 = std::
                 map<const_spvtools::opt::Loop_*,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_spvtools::opt::Loop_*const,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>_>_>_>
                 ::operator[]((map<const_spvtools::opt::Loop_*,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_spvtools::opt::Loop_*const,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>_>_>_>
                               *)local_58,(key_type *)&rec);
        __l._M_len = local_b0;
        __l._M_array = local_b8;
        std::
        vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>
        ::operator=(pmVar6,__l);
      }
      else {
        pmVar6 = std::
                 map<const_spvtools::opt::Loop_*,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_spvtools::opt::Loop_*const,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>_>_>_>
                 ::operator[]((map<const_spvtools::opt::Loop_*,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_spvtools::opt::Loop_*const,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>_>_>_>
                               *)local_58,(key_type *)&rec);
        pVar17 = std::make_pair<spvtools::opt::SERecurrentNode*&,bool&>
                           (&local_98,(bool *)((long)&loop + 7));
        local_e8.first = pVar17.first;
        local_e8.second = pVar17.second;
        std::
        vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>
        ::push_back(pmVar6,&local_e8);
        bVar3 = true;
      }
    }
    else {
      pSVar13 = std::
                unique_ptr<spvtools::opt::SEAddNode,_std::default_delete<spvtools::opt::SEAddNode>_>
                ::operator->((unique_ptr<spvtools::opt::SEAddNode,_std::default_delete<spvtools::opt::SEAddNode>_>
                              *)&loops_to_recurrent._M_t._M_impl.super__Rb_tree_header._M_node_count
                            );
      (*(pSVar13->super_SENode)._vptr_SENode[3])(pSVar13,pSStack_80);
    }
    __gnu_cxx::
    __normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>
    ::operator++(&__end2);
  }
  pSVar16 = (SENodeSimplifyImpl *)root;
  if (bVar3) {
    __end2_1 = std::
               map<const_spvtools::opt::Loop_*,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_spvtools::opt::Loop_*const,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>_>_>_>
               ::begin((map<const_spvtools::opt::Loop_*,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_spvtools::opt::Loop_*const,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>_>_>_>
                        *)local_58);
    pair.second.
    super__Vector_base<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  map<const_spvtools::opt::Loop_*,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_spvtools::opt::Loop_*const,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>_>_>_>
                  ::end((map<const_spvtools::opt::Loop_*,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_spvtools::opt::Loop_*const,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>_>_>_>
                         *)local_58);
    while (bVar3 = std::operator!=(&__end2_1,
                                   (_Self *)&pair.second.
                                             super__Vector_base<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage),
          bVar3) {
      ppVar7 = std::
               _Rb_tree_iterator<std::pair<const_spvtools::opt::Loop_*const,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>_>_>
               ::operator*(&__end2_1);
      std::
      pair<const_spvtools::opt::Loop_*const,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>_>
      ::pair((pair<const_spvtools::opt::Loop_*const,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>_>
              *)&recurrent_expressions,ppVar7);
      loop_00 = recurrent_expressions;
      pSVar8 = (pointer)::operator_new(0x30);
      SEAddNode::SEAddNode((SEAddNode *)pSVar8,this->analysis_);
      std::unique_ptr<spvtools::opt::SENode,std::default_delete<spvtools::opt::SENode>>::
      unique_ptr<std::default_delete<spvtools::opt::SENode>,void>
                ((unique_ptr<spvtools::opt::SENode,std::default_delete<spvtools::opt::SENode>> *)
                 &new_offset,pSVar8);
      pSVar8 = (pointer)::operator_new(0x30);
      SEAddNode::SEAddNode((SEAddNode *)pSVar8,this->analysis_);
      std::unique_ptr<spvtools::opt::SENode,std::default_delete<spvtools::opt::SENode>>::
      unique_ptr<std::default_delete<spvtools::opt::SENode>,void>
                ((unique_ptr<spvtools::opt::SENode,std::default_delete<spvtools::opt::SENode>> *)
                 &__range3,pSVar8);
      __end3 = std::
               vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>
               ::begin((vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>
                        *)&pair);
      node_pair._8_8_ =
           std::
           vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>
           ::end((vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>
                  *)&pair);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_*,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>_>
                                         *)&node_pair.second), bVar3) {
        ppVar9 = __gnu_cxx::
                 __normal_iterator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_*,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>_>
                 ::operator*(&__end3);
        pSVar10 = ppVar9->first;
        node_pair.first = *(SERecurrentNode **)&ppVar9->second;
        new_recurrent._M_t.
        super___uniq_ptr_impl<spvtools::opt::SERecurrentNode,_std::default_delete<spvtools::opt::SERecurrentNode>_>
        ._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::SERecurrentNode_*,_std::default_delete<spvtools::opt::SERecurrentNode>_>
        .super__Head_base<0UL,_spvtools::opt::SERecurrentNode_*,_false>._M_head_impl._7_1_ =
             (byte)node_pair.first & 1;
        if (((ulong)node_pair.first & 1) == 0) {
          pSVar8 = std::
                   unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>::
                   operator->(&new_offset);
          pSVar14 = SERecurrentNode::GetCoefficient(pSVar10);
          (*pSVar8->_vptr_SENode[3])(pSVar8,pSVar14);
          pSVar8 = std::
                   unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>::
                   operator->((unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>
                               *)&__range3);
          pSVar14 = SERecurrentNode::GetOffset(pSVar10);
          (*pSVar8->_vptr_SENode[3])(pSVar8,pSVar14);
        }
        else {
          pSVar8 = std::
                   unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>::
                   operator->(&new_offset);
          pSVar1 = this->analysis_;
          pSVar14 = SERecurrentNode::GetCoefficient(pSVar10);
          pSVar14 = ScalarEvolutionAnalysis::CreateNegation(pSVar1,pSVar14);
          (*pSVar8->_vptr_SENode[3])(pSVar8,pSVar14);
          pSVar8 = std::
                   unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>::
                   operator->((unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>
                               *)&__range3);
          pSVar1 = this->analysis_;
          pSVar14 = SERecurrentNode::GetOffset(pSVar10);
          pSVar14 = ScalarEvolutionAnalysis::CreateNegation(pSVar1,pSVar14);
          (*pSVar8->_vptr_SENode[3])(pSVar8,pSVar14);
        }
        __gnu_cxx::
        __normal_iterator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_*,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>_>
        ::operator++(&__end3);
      }
      pSVar10 = (SERecurrentNode *)::operator_new(0x48);
      SERecurrentNode::SERecurrentNode(pSVar10,this->analysis_,(Loop *)loop_00);
      std::
      unique_ptr<spvtools::opt::SERecurrentNode,std::default_delete<spvtools::opt::SERecurrentNode>>
      ::unique_ptr<std::default_delete<spvtools::opt::SERecurrentNode>,void>
                ((unique_ptr<spvtools::opt::SERecurrentNode,std::default_delete<spvtools::opt::SERecurrentNode>>
                  *)&new_coefficient_simplified,pSVar10);
      pSVar1 = this->analysis_;
      pSVar8 = std::unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>::
               get(&new_offset);
      new_offset_simplified = ScalarEvolutionAnalysis::SimplifyExpression(pSVar1,pSVar8);
      pSVar1 = this->analysis_;
      pSVar8 = std::unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>::
               get((unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_> *
                   )&__range3);
      local_1a8 = (SENodeSimplifyImpl *)ScalarEvolutionAnalysis::SimplifyExpression(pSVar1,pSVar8);
      iVar4 = (**new_offset_simplified->_vptr_SENode)();
      if (iVar4 == 0) {
        iVar4 = (*new_offset_simplified->_vptr_SENode[4])();
        iVar11 = SEConstantNode::FoldToSingleValue
                           ((SEConstantNode *)CONCAT44(extraout_var_01,iVar4));
        if (iVar11 != 0) goto LAB_00a363cb;
        this_local = local_1a8;
        bVar3 = true;
      }
      else {
LAB_00a363cb:
        pSVar12 = std::
                  unique_ptr<spvtools::opt::SERecurrentNode,_std::default_delete<spvtools::opt::SERecurrentNode>_>
                  ::operator->((unique_ptr<spvtools::opt::SERecurrentNode,_std::default_delete<spvtools::opt::SERecurrentNode>_>
                                *)&new_coefficient_simplified);
        SERecurrentNode::AddCoefficient(pSVar12,new_offset_simplified);
        pSVar12 = std::
                  unique_ptr<spvtools::opt::SERecurrentNode,_std::default_delete<spvtools::opt::SERecurrentNode>_>
                  ::operator->((unique_ptr<spvtools::opt::SERecurrentNode,_std::default_delete<spvtools::opt::SERecurrentNode>_>
                                *)&new_coefficient_simplified);
        SERecurrentNode::AddOffset(pSVar12,(SENode *)local_1a8);
        pSVar13 = std::
                  unique_ptr<spvtools::opt::SEAddNode,_std::default_delete<spvtools::opt::SEAddNode>_>
                  ::operator->((unique_ptr<spvtools::opt::SEAddNode,_std::default_delete<spvtools::opt::SEAddNode>_>
                                *)&loops_to_recurrent._M_t._M_impl.super__Rb_tree_header.
                                   _M_node_count);
        pSVar1 = this->analysis_;
        std::unique_ptr<spvtools::opt::SENode,std::default_delete<spvtools::opt::SENode>>::
        unique_ptr<spvtools::opt::SERecurrentNode,std::default_delete<spvtools::opt::SERecurrentNode>,void>
                  ((unique_ptr<spvtools::opt::SENode,std::default_delete<spvtools::opt::SENode>> *)
                   &local_1b0,
                   (unique_ptr<spvtools::opt::SERecurrentNode,_std::default_delete<spvtools::opt::SERecurrentNode>_>
                    *)&new_coefficient_simplified);
        pSVar14 = ScalarEvolutionAnalysis::GetCachedOrAdd(pSVar1,&local_1b0);
        (*(pSVar13->super_SENode)._vptr_SENode[3])(pSVar13,pSVar14);
        std::unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>::
        ~unique_ptr(&local_1b0);
        bVar3 = false;
      }
      std::
      unique_ptr<spvtools::opt::SERecurrentNode,_std::default_delete<spvtools::opt::SERecurrentNode>_>
      ::~unique_ptr((unique_ptr<spvtools::opt::SERecurrentNode,_std::default_delete<spvtools::opt::SERecurrentNode>_>
                     *)&new_coefficient_simplified);
      std::unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>::
      ~unique_ptr((unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_> *)
                  &__range3);
      std::unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>::
      ~unique_ptr(&new_offset);
      if (!bVar3) {
        bVar3 = false;
      }
      std::
      pair<const_spvtools::opt::Loop_*const,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>_>
      ::~pair((pair<const_spvtools::opt::Loop_*const,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>_>
               *)&recurrent_expressions);
      pSVar16 = this_local;
      if (bVar3) goto LAB_00a3656c;
      std::
      _Rb_tree_iterator<std::pair<const_spvtools::opt::Loop_*const,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>_>_>
      ::operator++(&__end2_1);
    }
    pSVar14 = &std::
               unique_ptr<spvtools::opt::SEAddNode,_std::default_delete<spvtools::opt::SEAddNode>_>
               ::operator->((unique_ptr<spvtools::opt::SEAddNode,_std::default_delete<spvtools::opt::SEAddNode>_>
                             *)&loops_to_recurrent._M_t._M_impl.super__Rb_tree_header._M_node_count)
               ->super_SENode;
    this_01 = SENode::GetChildren(pSVar14);
    sVar15 = std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>::size
                       (this_01);
    if (sVar15 == 1) {
      pSVar14 = &std::
                 unique_ptr<spvtools::opt::SEAddNode,_std::default_delete<spvtools::opt::SEAddNode>_>
                 ::operator->((unique_ptr<spvtools::opt::SEAddNode,_std::default_delete<spvtools::opt::SEAddNode>_>
                               *)&loops_to_recurrent._M_t._M_impl.super__Rb_tree_header.
                                  _M_node_count)->super_SENode;
      pSVar16 = (SENodeSimplifyImpl *)SENode::GetChild(pSVar14,0);
    }
    else {
      pSVar1 = this->analysis_;
      std::unique_ptr<spvtools::opt::SENode,std::default_delete<spvtools::opt::SENode>>::
      unique_ptr<spvtools::opt::SEAddNode,std::default_delete<spvtools::opt::SEAddNode>,void>
                ((unique_ptr<spvtools::opt::SENode,std::default_delete<spvtools::opt::SENode>> *)
                 &local_1b8,
                 (unique_ptr<spvtools::opt::SEAddNode,_std::default_delete<spvtools::opt::SEAddNode>_>
                  *)&loops_to_recurrent._M_t._M_impl.super__Rb_tree_header._M_node_count);
      pSVar16 = (SENodeSimplifyImpl *)ScalarEvolutionAnalysis::GetCachedOrAdd(pSVar1,&local_1b8);
      std::unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>::
      ~unique_ptr(&local_1b8);
    }
  }
LAB_00a3656c:
  this_local = pSVar16;
  std::
  map<const_spvtools::opt::Loop_*,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_spvtools::opt::Loop_*const,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>_>_>_>
  ::~map((map<const_spvtools::opt::Loop_*,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_spvtools::opt::Loop_*const,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>_>_>_>
          *)local_58);
  std::unique_ptr<spvtools::opt::SEAddNode,_std::default_delete<spvtools::opt::SEAddNode>_>::
  ~unique_ptr((unique_ptr<spvtools::opt::SEAddNode,_std::default_delete<spvtools::opt::SEAddNode>_>
               *)&loops_to_recurrent._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return (SENode *)this_local;
}

Assistant:

SENode* SENodeSimplifyImpl::FoldRecurrentAddExpressions(SENode* root) {
  std::unique_ptr<SEAddNode> new_node{new SEAddNode(&analysis_)};

  // A mapping of loops to the list of recurrent expressions which are with
  // respect to those loops.
  std::map<const Loop*, std::vector<std::pair<SERecurrentNode*, bool>>>
      loops_to_recurrent{};

  bool has_multiple_same_loop_recurrent_terms = false;

  for (SENode* child : *root) {
    bool negation = false;

    if (child->GetType() == SENode::Negative) {
      child = child->GetChild(0);
      negation = true;
    }

    if (child->GetType() == SENode::RecurrentAddExpr) {
      const Loop* loop = child->AsSERecurrentNode()->GetLoop();

      SERecurrentNode* rec = child->AsSERecurrentNode();
      if (loops_to_recurrent.find(loop) == loops_to_recurrent.end()) {
        loops_to_recurrent[loop] = {std::make_pair(rec, negation)};
      } else {
        loops_to_recurrent[loop].push_back(std::make_pair(rec, negation));
        has_multiple_same_loop_recurrent_terms = true;
      }
    } else {
      new_node->AddChild(child);
    }
  }

  if (!has_multiple_same_loop_recurrent_terms) return root;

  for (auto pair : loops_to_recurrent) {
    std::vector<std::pair<SERecurrentNode*, bool>>& recurrent_expressions =
        pair.second;
    const Loop* loop = pair.first;

    std::unique_ptr<SENode> new_coefficient{new SEAddNode(&analysis_)};
    std::unique_ptr<SENode> new_offset{new SEAddNode(&analysis_)};

    for (auto node_pair : recurrent_expressions) {
      SERecurrentNode* node = node_pair.first;
      bool negative = node_pair.second;

      if (!negative) {
        new_coefficient->AddChild(node->GetCoefficient());
        new_offset->AddChild(node->GetOffset());
      } else {
        new_coefficient->AddChild(
            analysis_.CreateNegation(node->GetCoefficient()));
        new_offset->AddChild(analysis_.CreateNegation(node->GetOffset()));
      }
    }

    std::unique_ptr<SERecurrentNode> new_recurrent{
        new SERecurrentNode(&analysis_, loop)};

    SENode* new_coefficient_simplified =
        analysis_.SimplifyExpression(new_coefficient.get());

    SENode* new_offset_simplified =
        analysis_.SimplifyExpression(new_offset.get());

    if (new_coefficient_simplified->GetType() == SENode::Constant &&
        new_coefficient_simplified->AsSEConstantNode()->FoldToSingleValue() ==
            0) {
      return new_offset_simplified;
    }

    new_recurrent->AddCoefficient(new_coefficient_simplified);
    new_recurrent->AddOffset(new_offset_simplified);

    new_node->AddChild(analysis_.GetCachedOrAdd(std::move(new_recurrent)));
  }

  // If we only have one child in the add just return that.
  if (new_node->GetChildren().size() == 1) {
    return new_node->GetChild(0);
  }

  return analysis_.GetCachedOrAdd(std::move(new_node));
}